

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring.c
# Opt level: O2

double p_strtod(pchar *str)

{
  ushort *puVar1;
  bool bVar2;
  uint uVar3;
  byte *mem;
  ushort **ppuVar4;
  byte bVar5;
  uint uVar6;
  byte *pbVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_30;
  
  mem = (byte *)p_strchomp(str);
  if (mem == (byte *)0x0) {
    dVar8 = 0.0;
  }
  else {
    dVar8 = 1.0;
    if (*mem == 0x2b) {
      pbVar7 = mem + 1;
    }
    else {
      pbVar7 = mem;
      if (*mem == 0x2d) {
        pbVar7 = mem + 1;
        dVar8 = -1.0;
      }
    }
    ppuVar4 = __ctype_b_loc();
    puVar1 = *ppuVar4;
    dVar10 = 0.0;
    while (bVar5 = *pbVar7, (*(byte *)((long)puVar1 + (long)(char)bVar5 * 2 + 1) & 8) != 0) {
      dVar10 = dVar10 * 10.0 + (double)((char)bVar5 + -0x30);
      pbVar7 = pbVar7 + 1;
    }
    if (bVar5 == 0x2e) {
      dVar9 = 10.0;
      while( true ) {
        pbVar7 = pbVar7 + 1;
        bVar5 = *pbVar7;
        if ((*(byte *)((long)puVar1 + (long)(char)bVar5 * 2 + 1) & 8) == 0) break;
        dVar10 = dVar10 + (double)((char)bVar5 + -0x30) / dVar9;
        dVar9 = dVar9 * 10.0;
      }
    }
    if ((bVar5 | 0x20) == 0x65) {
      bVar2 = true;
      if (pbVar7[1] == 0x2b) {
        pbVar7 = pbVar7 + 2;
      }
      else if (pbVar7[1] == 0x2d) {
        pbVar7 = pbVar7 + 2;
        bVar2 = false;
      }
      else {
        pbVar7 = pbVar7 + 1;
      }
      uVar6 = 0;
      while ((*(byte *)((long)puVar1 + (long)(char)*pbVar7 * 2 + 1) & 8) != 0) {
        uVar6 = (uVar6 * 10 + (int)(char)*pbVar7) - 0x30;
        pbVar7 = pbVar7 + 1;
      }
      if (0x134 < uVar6) {
        uVar6 = 0x134;
      }
      local_30 = 1.0;
      for (; 0x31 < uVar6; uVar6 = uVar6 - 0x32) {
        local_30 = local_30 * 1e+50;
      }
      for (; 7 < uVar6; uVar6 = uVar6 - 8) {
        local_30 = local_30 * 100000000.0;
      }
      for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
        local_30 = local_30 * 10.0;
      }
    }
    else {
      bVar2 = true;
      local_30 = 1.0;
    }
    p_free(mem);
    if (bVar2) {
      dVar10 = dVar10 * local_30;
    }
    else {
      dVar10 = dVar10 / local_30;
    }
    dVar8 = dVar8 * dVar10;
  }
  return dVar8;
}

Assistant:

P_LIB_API double
p_strtod (const pchar *str)
{
	double		sign;
	double		value;
	double		scale;
	double		pow10;
	puint		expon;
	pint		frac;
	pchar		*orig_str;
	const pchar	*strp;

	orig_str = p_strchomp (str);

	if (P_UNLIKELY (orig_str == NULL))
		return 0.0;

	strp = orig_str;
	sign = 1.0;

	if (*strp == '-') {
		sign = -1.0;
		strp += 1;
	} else if (*strp == '+')
		strp += 1;

	/* Get digits before decimal point or exponent, if any */
	for (value = 0.0; isdigit ((pint) *strp); strp += 1)
		value = value * 10.0 + (*strp - '0');

	/* Get digits after decimal point, if any */
	if (*strp == '.') {
		pow10 = 10.0;
		strp += 1;

		while (isdigit ((pint) *strp)) {
			value += (*strp - '0') / pow10;
			pow10 *= 10.0;
			strp += 1;
		}
	}

	/* Handle exponent, if any */
	frac  = 0;
	scale = 1.0;

	if ((*strp == 'e') || (*strp == 'E')) {
		/* Get sign of exponent, if any */
		strp += 1;

		if (*strp == '-') {
			frac = 1;
			strp += 1;

		} else if (*strp == '+')
			strp += 1;

		/* Get digits of exponent, if any */
		for (expon = 0; isdigit ((pint) *strp); strp += 1)
			expon = expon * 10 + (puint) (*strp - '0');

		if (P_UNLIKELY (expon > P_STR_MAX_EXPON))
			expon = P_STR_MAX_EXPON;

		/* Calculate scaling factor */
		while (expon >= 50) {
			scale *= 1e50;
			expon -= 50;
		}

		while (expon >= 8) {
			scale *= 1e8;
			expon -= 8;
		}

		while (expon > 0) {
			scale *= 10.0;
			expon -= 1;
		}
	}

	p_free (orig_str);

	/* Return signed and scaled floating point result */
	return sign * (frac ? (value / scale) : (value * scale));
}